

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

void * v2i_idp(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  char *value;
  int iVar1;
  CONF_VALUE *pCVar2;
  int ret;
  char *val;
  char *name;
  CONF_VALUE *cnf;
  size_t i;
  ISSUING_DIST_POINT *idp;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)ISSUING_DIST_POINT_new();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
LAB_002e74fc:
    ISSUING_DIST_POINT_free((ISSUING_DIST_POINT *)method_local);
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(nval), cnf < pCVar2;
        cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value(nval,(size_t)cnf);
      __s1 = pCVar2->name;
      value = pCVar2->value;
      iVar1 = set_dist_point_name((DIST_POINT_NAME **)method_local,ctx,pCVar2);
      if (iVar1 < 1) {
        if (iVar1 < 0) goto LAB_002e74fc;
        iVar1 = strcmp(__s1,"onlyuser");
        if (iVar1 == 0) {
          iVar1 = X509V3_get_value_bool((CONF_VALUE *)pCVar2,(int *)&method_local->it);
        }
        else {
          iVar1 = strcmp(__s1,"onlyCA");
          if (iVar1 == 0) {
            iVar1 = X509V3_get_value_bool((CONF_VALUE *)pCVar2,(int *)((long)&method_local->it + 4))
            ;
          }
          else {
            iVar1 = strcmp(__s1,"onlyAA");
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"indirectCRL");
              if (iVar1 == 0) {
                iVar1 = X509V3_get_value_bool((CONF_VALUE *)pCVar2,(int *)&method_local->ext_free);
              }
              else {
                iVar1 = strcmp(__s1,"onlysomereasons");
                if (iVar1 != 0) {
                  ERR_put_error(0x14,0,0x7b,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                                ,0x1ba);
                  ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                                     pCVar2->value);
                  goto LAB_002e74fc;
                }
                iVar1 = set_reasons((ASN1_BIT_STRING **)&method_local->ext_new,value);
              }
              if (iVar1 != 0) goto LAB_002e74e1;
              goto LAB_002e74fc;
            }
            iVar1 = X509V3_get_value_bool
                              ((CONF_VALUE *)pCVar2,(int *)((long)&method_local->ext_free + 4));
          }
        }
        if (iVar1 == 0) goto LAB_002e74fc;
      }
LAB_002e74e1:
    }
  }
  return method_local;
}

Assistant:

static void *v2i_idp(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                     const STACK_OF(CONF_VALUE) *nval) {
  ISSUING_DIST_POINT *idp = ISSUING_DIST_POINT_new();
  if (!idp) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    const char *name = cnf->name;
    const char *val = cnf->value;
    int ret = set_dist_point_name(&idp->distpoint, ctx, cnf);
    if (ret > 0) {
      continue;
    }
    if (ret < 0) {
      goto err;
    }
    if (!strcmp(name, "onlyuser")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyuser)) {
        goto err;
      }
    } else if (!strcmp(name, "onlyCA")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyCA)) {
        goto err;
      }
    } else if (!strcmp(name, "onlyAA")) {
      if (!X509V3_get_value_bool(cnf, &idp->onlyattr)) {
        goto err;
      }
    } else if (!strcmp(name, "indirectCRL")) {
      if (!X509V3_get_value_bool(cnf, &idp->indirectCRL)) {
        goto err;
      }
    } else if (!strcmp(name, "onlysomereasons")) {
      if (!set_reasons(&idp->onlysomereasons, val)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(cnf);
      goto err;
    }
  }
  return idp;

err:
  ISSUING_DIST_POINT_free(idp);
  return NULL;
}